

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rtreecheck(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  int errCode;
  uchar *puVar1;
  uchar *zTab;
  uchar *zDb;
  char *z;
  char *p;
  long in_FS_OFFSET;
  char *zReport;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (nArg - 3U < 0xfffffffe) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      sqlite3_result_error(ctx,"wrong number of arguments to function rtreecheck()",-1);
      return;
    }
  }
  else {
    zReport = (char *)0x0;
    puVar1 = sqlite3_value_text(*apArg);
    if (nArg == 1) {
      zDb = (uchar *)"main";
      zTab = puVar1;
    }
    else {
      zTab = sqlite3_value_text(apArg[1]);
      zDb = puVar1;
    }
    errCode = rtreeCheckTable(ctx->pOut->db,(char *)zDb,(char *)zTab,&zReport);
    p = zReport;
    if (errCode == 0) {
      z = "ok";
      if (zReport != (char *)0x0) {
        z = zReport;
      }
      sqlite3_result_text(ctx,z,-1,(_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      sqlite3_result_error_code(ctx,errCode);
      p = zReport;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      sqlite3_free(p);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void rtreecheck(
  sqlite3_context *ctx,
  int nArg,
  sqlite3_value **apArg
){
  if( nArg!=1 && nArg!=2 ){
    sqlite3_result_error(ctx,
        "wrong number of arguments to function rtreecheck()", -1
    );
  }else{
    int rc;
    char *zReport = 0;
    const char *zDb = (const char*)sqlite3_value_text(apArg[0]);
    const char *zTab;
    if( nArg==1 ){
      zTab = zDb;
      zDb = "main";
    }else{
      zTab = (const char*)sqlite3_value_text(apArg[1]);
    }
    rc = rtreeCheckTable(sqlite3_context_db_handle(ctx), zDb, zTab, &zReport);
    if( rc==SQLITE_OK ){
      sqlite3_result_text(ctx, zReport ? zReport : "ok", -1, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_error_code(ctx, rc);
    }
    sqlite3_free(zReport);
  }
}